

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  unsigned_long uVar1;
  size_t *psVar2;
  ulong *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  unsigned_long uVar12;
  ulong *puVar13;
  unsigned_long *puVar14;
  ulong *key;
  size_t row;
  double dVar15;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar16;
  tuple<> local_99;
  double local_98;
  size_t *local_90;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_88;
  double *local_80;
  double local_78;
  double local_70;
  unsigned_long *local_68;
  ulong *local_60;
  unsigned_long local_58;
  double local_50;
  double local_48;
  double local_40;
  unsigned_long local_38;
  
  local_98 = (double)Xc_indptr[col_num];
  local_58 = Xc_indptr[col_num + 1];
  if (local_98 == (double)local_58) {
    *x_sd = 0.0;
    *x_mean = 0.0;
  }
  else {
    puVar13 = ix_arr + st;
    local_60 = ix_arr + end + 1;
    uVar6 = (long)local_60 - (long)puVar13 >> 3;
    key = puVar13;
    if (0 < (long)uVar6) {
      do {
        uVar7 = uVar6 >> 1;
        uVar9 = ~uVar7 + uVar6;
        uVar6 = uVar7;
        if (key[uVar7] < Xc_ind[(long)local_98]) {
          key = key + uVar7 + 1;
          uVar6 = uVar9;
        }
      } while (0 < (long)uVar6);
    }
    local_38 = Xc_ind[local_58 - 1];
    local_78 = 0.0;
    local_70 = 0.0;
    local_90 = ix_arr;
    local_80 = Xc;
    local_68 = Xc_ind;
    if (st <= end) {
      do {
        local_88._M_head_impl = puVar13;
        pVar16 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,puVar13,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_88,&local_99);
        local_70 = local_70 + *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
        st = st + 1;
        puVar13 = puVar13 + 1;
      } while (st <= end);
    }
    uVar5 = local_58;
    puVar4 = local_68;
    if (local_98 == (double)local_58 || key == local_60) {
      local_98 = 0.0;
      local_50 = 0.0;
    }
    else {
      uVar1 = local_58 - 1;
      psVar2 = local_90 + end;
      local_90 = (size_t *)0x0;
      local_50 = 0.0;
      local_78 = 0.0;
      dVar15 = local_98;
      pdVar11 = local_80;
      uVar12 = local_58;
      puVar13 = local_60;
      puVar14 = local_68;
      local_98 = 0.0;
      while (uVar6 = *key, uVar6 <= local_38) {
        puVar3 = puVar14 + (long)dVar15;
        uVar7 = *puVar3;
        if (uVar7 == uVar6) {
          local_88._M_head_impl = key;
          if ((ulong)ABS(pdVar11[(long)dVar15]) < 0x7ff0000000000000) {
            pVar16 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_88,&local_99);
            if ((local_78 == 0.0) && (!NAN(local_78))) {
              local_90 = (size_t *)local_80[(long)dVar15];
            }
            local_40 = *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
            local_78 = local_78 + local_40;
            local_48 = local_80[(long)dVar15];
            local_98 = fma(local_40,(local_48 - local_98) / local_78,local_98);
            local_50 = fma(local_40,(local_48 - (double)local_90) * (local_48 - local_98),local_50);
            local_90 = (size_t *)local_98;
          }
          else {
            pVar16 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_88,&local_99);
            local_70 = local_70 - *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
          }
          if ((key == psVar2) || (dVar15 == (double)uVar1)) break;
          puVar8 = puVar3 + 1;
          key = key + 1;
          uVar6 = (long)((long)puVar4 + (uVar5 * 8 - (long)puVar8)) >> 3;
          pdVar11 = local_80;
          uVar12 = local_58;
          puVar13 = local_60;
          puVar14 = local_68;
          if (0 < (long)uVar6) {
            do {
              uVar7 = uVar6 >> 1;
              uVar9 = ~uVar7 + uVar6;
              uVar6 = uVar7;
              if ((puVar8 + uVar7 + 1)[-1] < *key) {
                puVar8 = puVar8 + uVar7 + 1;
                uVar6 = uVar9;
              }
            } while (0 < (long)uVar6);
          }
LAB_002287e6:
          dVar15 = (double)((long)puVar8 - (long)puVar14 >> 3);
        }
        else {
          if (uVar7 <= uVar6) {
            puVar8 = puVar3 + 1;
            uVar7 = (long)((long)puVar4 + (uVar5 * 8 - (long)(puVar3 + 1))) >> 3;
            while (0 < (long)uVar7) {
              uVar9 = uVar7 >> 1;
              uVar10 = ~uVar9 + uVar7;
              uVar7 = uVar9;
              if ((puVar8 + uVar9 + 1)[-1] < uVar6) {
                puVar8 = puVar8 + uVar9 + 1;
                uVar7 = uVar10;
              }
            }
            goto LAB_002287e6;
          }
          key = key + 1;
          uVar6 = (long)puVar13 - (long)key >> 3;
          while (0 < (long)uVar6) {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if (key[uVar9] < uVar7) {
              key = key + uVar9 + 1;
              uVar6 = uVar10;
            }
          }
        }
        if ((key == puVar13) || (dVar15 == (double)uVar12)) break;
      }
    }
    dVar15 = 0.0;
    if ((local_78 != 0.0) || (NAN(local_78))) {
      if (local_78 < local_70) {
        local_50 = local_50 + (1.0 - local_78 / local_70) * local_78 * local_98 * local_98;
        local_98 = local_98 * (local_78 / local_70);
      }
      *x_mean = local_98;
      dVar15 = SQRT(local_50 / local_70);
    }
    else {
      *x_mean = 0.0;
    }
    *x_sd = dVar15;
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}